

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

GPU_Renderer * gpu_create_and_add_renderer(GPU_RendererID id)

{
  GPU_RendererID id_00;
  GPU_Renderer *pGVar1;
  undefined8 unaff_R14;
  long lVar2;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  
  lVar2 = 0;
  do {
    if (*(long *)((long)_gpu_renderer_map + lVar2) == 0) {
      id_00._8_8_ = unaff_R15;
      id_00.name = (char *)unaff_R14;
      id_00._16_8_ = unaff_retaddr;
      pGVar1 = GPU_CreateRenderer(id_00);
      if (pGVar1 != (GPU_Renderer *)0x0) {
        *(GPU_Renderer **)((long)_gpu_renderer_map + lVar2) = pGVar1;
        return pGVar1;
      }
      GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                        "Failed to create new renderer.");
      return (GPU_Renderer *)0x0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0xa0);
  GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                    "Couldn\'t create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d)."
                    ,0x14);
  return (GPU_Renderer *)0x0;
}

Assistant:

GPU_Renderer* gpu_create_and_add_renderer(GPU_RendererID id)
{
	int i;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] == NULL)
		{
			// Create
			GPU_Renderer* renderer = GPU_CreateRenderer(id);
			if(renderer == NULL)
            {
                GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Failed to create new renderer.");
                return NULL;
            }
            
			// Add
			_gpu_renderer_map[i] = renderer;
			// Return
			return renderer;
		}
	}
	
    GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Couldn't create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d).", GPU_MAX_ACTIVE_RENDERERS);
	return NULL;
}